

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O1

Move<vk::VkCommandBuffer_s_*> *
vkt::drawutil::makeCommandBuffer
          (Move<vk::VkCommandBuffer_s_*> *__return_storage_ptr__,DeviceInterface *vk,VkDevice device
          ,VkCommandPool commandPool)

{
  VkCommandBufferAllocateInfo info;
  VkCommandBufferAllocateInfo local_28;
  
  local_28.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_28.pNext = (void *)0x0;
  local_28.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_28.commandBufferCount = 1;
  local_28.commandPool.m_internal = commandPool.m_internal;
  ::vk::allocateCommandBuffer(__return_storage_ptr__,vk,device,&local_28);
  return __return_storage_ptr__;
}

Assistant:

Move<VkCommandBuffer> makeCommandBuffer (const DeviceInterface& vk, const VkDevice device, const VkCommandPool commandPool)
{
	const VkCommandBufferAllocateInfo info =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,		// VkStructureType		sType;
		DE_NULL,											// const void*			pNext;
		commandPool,										// VkCommandPool		commandPool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,					// VkCommandBufferLevel	level;
		1u,													// deUint32				commandBufferCount;
	};
	return allocateCommandBuffer(vk, device, &info);
}